

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_fe4d0d::GetListString(string *listString,string *var,cmMakefile *makefile)

{
  bool bVar1;
  string *psVar2;
  cmValue local_30;
  cmValue cacheValue;
  cmMakefile *makefile_local;
  string *var_local;
  string *listString_local;
  
  cacheValue.Value = (string *)makefile;
  local_30 = cmMakefile::GetDefinition(makefile,var);
  bVar1 = cmValue::operator_cast_to_bool(&local_30);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_30);
    std::__cxx11::string::operator=((string *)listString,(string *)psVar2);
  }
  return bVar1;
}

Assistant:

bool GetListString(std::string& listString, const std::string& var,
                   const cmMakefile& makefile)
{
  // get the old value
  cmValue cacheValue = makefile.GetDefinition(var);
  if (!cacheValue) {
    return false;
  }
  listString = *cacheValue;
  return true;
}